

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall
Centaurus::CharClass<wchar_t>::collect_borders
          (CharClass<wchar_t> *this,set<wchar_t,_std::less<wchar_t>,_std::allocator<wchar_t>_> *dest
          )

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<wchar_t>,_bool> pVar2;
  wchar_t local_54;
  _Base_ptr local_50;
  undefined1 local_48;
  wchar_t local_3c;
  reference local_38;
  Range<wchar_t> *r;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *__range2;
  set<wchar_t,_std::less<wchar_t>,_std::allocator<wchar_t>_> *dest_local;
  CharClass<wchar_t> *this_local;
  
  __end0 = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
           begin(&this->m_ranges);
  r = (Range<wchar_t> *)
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::end
                (&this->m_ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                *)&r);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator*(&__end0);
    local_3c = Range<wchar_t>::start(local_38);
    pVar2 = std::set<wchar_t,_std::less<wchar_t>,_std::allocator<wchar_t>_>::insert(dest,&local_3c);
    local_50 = (_Base_ptr)pVar2.first._M_node;
    local_48 = pVar2.second;
    local_54 = Range<wchar_t>::end(local_38);
    std::set<wchar_t,_std::less<wchar_t>,_std::allocator<wchar_t>_>::insert(dest,&local_54);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void collect_borders(std::set<TCHAR>& dest) const
    {
        for (const auto& r : m_ranges)
        {
            dest.insert(r.start());
            dest.insert(r.end());
        }
    }